

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  char *__s;
  size_t sVar9;
  long *plVar10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  mapped_type *this_00;
  long lVar13;
  pointer piVar14;
  ulong uVar15;
  iterator __position;
  string *t;
  pointer pbVar16;
  int retVal;
  string lcovFile;
  string nl;
  string lineNumber;
  string output;
  string actualSourceFile;
  string errors;
  string fileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string daGlob;
  string sourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string srcname;
  string dir;
  string st2lcovOutputRex3;
  ostringstream cmCTestLog_msg_15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  covargs;
  string command;
  string lcovCommand;
  string lcovExtraFlags;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_21;
  string testingDir;
  cmWorkingDirectory workdir;
  cmCTestCoverageHandlerLocale locale_C;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  RegularExpression st2re3;
  bool local_a25;
  int local_a24;
  int local_a14;
  string *local_a10;
  char *local_a08;
  long local_a00;
  char local_9f8;
  undefined7 uStack_9f7;
  int local_9e4;
  string local_9e0;
  long *local_9c0 [2];
  long local_9b0 [2];
  string local_9a0;
  key_type local_980;
  int local_95c;
  string local_958;
  string local_938;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_918;
  string local_8f8;
  char *local_8d8;
  long local_8d0;
  char local_8c8;
  undefined7 uStack_8c7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8b8;
  string local_8a0;
  undefined1 *local_880;
  undefined8 local_878;
  undefined1 local_870;
  undefined7 uStack_86f;
  long *local_860 [2];
  long local_850 [2];
  long *local_840 [2];
  long local_830 [2];
  byte abStack_820 [80];
  ios_base local_7d0 [408];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618;
  string local_600;
  string local_5e0;
  string *local_5c0;
  pointer local_5b8;
  pointer local_5b0;
  TotalCoverageMap *local_5a8;
  pointer local_5a0;
  pointer local_598;
  string local_590;
  undefined1 local_570 [32];
  byte abStack_550 [80];
  ios_base local_500 [408];
  undefined1 local_368 [16];
  _func_int *local_358 [12];
  ios_base local_2f8 [264];
  string local_1f0;
  cmWorkingDirectory local_1d0;
  cmCTestCoverageHandlerLocale local_1a8;
  Glob local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  RegularExpression local_100;
  
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_570 + 0x10;
  local_570._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"CoverageCommand","");
  cmCTest::GetCTestConfiguration(&local_5e0,pcVar2,(string *)local_570);
  if ((pointer)local_570._0_8_ != pcVar1) {
    operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_570._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"CoverageExtraFlags","");
  cmCTest::GetCTestConfiguration(&local_590,pcVar2,(string *)local_570);
  if ((pointer)local_570._0_8_ != pcVar1) {
    operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_5e0);
  if (iVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_570," Not a valid Intel Coverage command.",0x24);
    std::ios::widen((char)(ostream *)local_570 + (char)*(undefined8 *)(local_570._0_8_ + -0x18));
    std::ostream::put((char)local_570);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x532,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
    if (local_840[0] != local_830) {
      operator_delete(local_840[0],local_830[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
    std::ios_base::~ios_base(local_500);
    local_a24 = 0;
    goto LAB_00178c16;
  }
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_860,"[0-9]+%","");
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  if (local_860[0] != (long *)0x0) {
    cmsys::RegularExpression::compile(&local_100,(char *)local_860[0]);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_570," This is coverage command: ",0x1b);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_570,local_5e0._M_dataplus._M_p,local_5e0._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x53b,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
  if (local_840[0] != local_830) {
    operator_delete(local_840[0],local_830[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
  std::ios_base::~ios_base(local_500);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_570," These are coverage command flags: ",0x23);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_570,local_590._M_dataplus._M_p,local_590._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x540,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
  if (local_840[0] != local_830) {
    operator_delete(local_840[0],local_830[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
  std::ios_base::~ios_base(local_500);
  local_8b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_8b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_8b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = FindLCovFiles(this,&local_8b8);
  if (bVar4) {
    if (local_8b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_570," Cannot find any LCov coverage files.",0x25);
      std::ios::widen((char)(ostream *)local_570 + (char)*(undefined8 *)(local_570._0_8_ + -0x18));
      std::ostream::put((char)local_570);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x54c,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_00178aeb;
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_1f0,(this->super_cmCTestGenericHandler).CTest);
    local_130._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_130._M_impl.super__Rb_tree_header._M_header;
    local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
    local_980._M_string_length = 0;
    local_980.field_2._M_local_buf[0] = '\0';
    local_130._M_impl.super__Rb_tree_header._M_header._M_right =
         local_130._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_570,"   Processing coverage (each . represents one file):",0x34);
    std::ios::widen((char)(ostream *)local_570 + (char)*(undefined8 *)(local_570._0_8_ + -0x18));
    std::ostream::put((char)local_570);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x558,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
    if (local_840[0] != local_830) {
      operator_delete(local_840[0],local_830[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
    std::ios_base::~ios_base(local_500);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_570,"    ",4);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x559,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
    if (local_840[0] != local_830) {
      operator_delete(local_840[0],local_830[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
    std::ios_base::~ios_base(local_500);
    cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&local_1a8);
    cmSystemTools::ParseArguments(&local_618,&local_590);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&local_618,
             (const_iterator)
             local_618.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_5e0);
    joinCommandLine(&local_600,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_618.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_a10 = local_8b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_5c0 = local_8b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_8b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00178b38:
      local_a24 = 0;
    }
    else {
      local_5a8 = &cont->TotalCoverage;
      local_a24 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_570,".",1);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x569,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
        if (local_840[0] != local_830) {
          operator_delete(local_840[0],local_830[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
        std::ios_base::~ios_base(local_500);
        cmsys::SystemTools::GetFilenamePath(&local_938,local_a10);
        cmWorkingDirectory::cmWorkingDirectory(&local_1d0,&local_938);
        if (local_1d0.ResultCode == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_570,"Current coverage dir: ",0x16);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_570,local_938._M_dataplus._M_p,
                              local_938._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x577,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
          if (local_840[0] != local_830) {
            operator_delete(local_840[0],local_830[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
          std::ios_base::~ios_base(local_500);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_570,local_600._M_dataplus._M_p,
                              local_600._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x579,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
          if (local_840[0] != local_830) {
            operator_delete(local_840[0],local_830[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
          std::ios_base::~ios_base(local_500);
          local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
          local_9a0._M_string_length = 0;
          local_9a0.field_2._M_local_buf[0] = '\0';
          local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
          local_958._M_string_length = 0;
          local_958.field_2._M_local_buf[0] = '\0';
          local_a14 = 0;
          poVar8 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"* Run coverage for: ",0x14);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_938._M_dataplus._M_p,local_938._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          poVar8 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Command: ",0xb);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_600._M_dataplus._M_p,local_600._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          bVar4 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,&local_618,
                                      &local_9a0,&local_958,&local_a14,local_938._M_dataplus._M_p,
                                      (cmDuration)0x0,Auto);
          poVar8 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Output: ",10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_9a0._M_dataplus._M_p,local_9a0._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          poVar8 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  Errors: ",10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_958._M_dataplus._M_p,local_958._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if (bVar4) {
            if (local_a14 != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_570,"Coverage command returned: ",0x1b);
              poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)local_570,local_a14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," while processing: ",0x13);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(local_a10->_M_dataplus)._M_p,local_a10->_M_string_length);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x591,(char *)local_840[0],false);
              if (local_840[0] != local_830) {
                operator_delete(local_840[0],local_830[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
              std::ios_base::~ios_base(local_500);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_570,"Command produced error: ",0x18);
              plVar10 = (long *)std::ostream::operator<<((ostringstream *)local_570,cont->Error);
              std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
              std::ostream::put((char)plVar10);
              std::ostream::flush();
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x593,(char *)local_840[0],false);
              if (local_840[0] != local_830) {
                operator_delete(local_840[0],local_830[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
              std::ios_base::~ios_base(local_500);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_570,
                       "--------------------------------------------------------------",0x3e);
            cVar3 = (char)(ostringstream *)local_570;
            std::ios::widen((char)*(undefined8 *)(local_570._0_8_ + -0x18) + cVar3);
            std::ostream::put(cVar3);
            poVar8 = (ostream *)std::ostream::flush();
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_9a0._M_dataplus._M_p,local_9a0._M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"--------------------------------------------------------------",0x3e)
            ;
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x59c,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
            if (local_840[0] != local_830) {
              operator_delete(local_840[0],local_830[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
            std::ios_base::~ios_base(local_500);
            local_638.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_638.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_638.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmsys::SystemTools::Split(&local_9a0,&local_638);
            local_5b8 = local_638.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            pbVar11 = local_638.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_638.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_638.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                local_8d8 = &local_8c8;
                local_8d0 = 0;
                local_8c8 = '\0';
                local_a08 = &local_9f8;
                local_a00 = 0;
                local_9f8 = '\0';
                local_5b0 = pbVar11;
                cmsys::Glob::Glob(&local_188);
                local_188.Recurse = true;
                local_188.RecurseThroughSymlinks = false;
                local_880 = &local_870;
                local_878 = 0;
                local_870 = 0;
                local_918.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_918.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_918.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                cmCTest::GetBinaryDir_abi_cxx11_
                          ((string *)local_570,(this->super_cmCTestGenericHandler).CTest);
                std::__cxx11::string::operator=((string *)&local_880,(string *)local_570);
                if ((undefined1 *)local_570._0_8_ != local_570 + 0x10) {
                  operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
                }
                local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
                local_8f8._M_string_length = 0;
                local_8f8.field_2._M_local_buf[0] = '\0';
                std::__cxx11::string::_M_assign((string *)&local_8f8);
                std::__cxx11::string::append((char *)&local_8f8);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_570,"   looking for LCOV files in: ",0x1e);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_570,local_8f8._M_dataplus._M_p,
                                    local_8f8._M_string_length);
                std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
                pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5b6,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
                if (local_840[0] != local_830) {
                  operator_delete(local_840[0],local_830[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
                std::ios_base::~ios_base(local_500);
                cmsys::Glob::FindFiles(&local_188,&local_8f8,(GlobMessages *)0x0);
                pvVar12 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_918,
                           local_918.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (pvVar12->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (pvVar12->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
                local_9e4 = 0;
                local_5a0 = local_918.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                pbVar11 = local_918.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (local_918.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_918.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_a25 = true;
                }
                else {
                  do {
                    local_598 = pbVar11;
                    std::__cxx11::string::_M_assign((string *)&local_a08);
                    std::ifstream::ifstream((istream *)local_570,local_a08,_S_in);
                    if ((abStack_550[*(long *)(local_570._0_8_ + -0x18)] & 5) != 0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_840,"Cannot open file: ",0x12);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_840,local_a08,local_a00);
                      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5c0,(char *)local_368._0_8_,false);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
                      std::ios_base::~ios_base(local_7d0);
                    }
                    local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
                    local_8a0._M_string_length = 0;
                    local_8a0.field_2._M_local_buf[0] = '\0';
                    local_a25 = cmsys::SystemTools::GetLineFromStream
                                          ((istream *)local_570,&local_8a0,(bool *)0x0,-1);
                    if (local_a25) {
                      std::__cxx11::string::substr((ulong)local_840,(ulong)&local_8a0);
                      std::__cxx11::string::operator=((string *)&local_8a0,(string *)local_840);
                      if (local_840[0] != local_830) {
                        operator_delete(local_840[0],local_830[0] + 1);
                      }
                      std::__cxx11::string::_M_assign((string *)&local_8d8);
                      std::__cxx11::string::_M_assign((string *)&local_980);
                      pbVar11 = local_918.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      for (pbVar16 = local_918.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar11;
                          pbVar16 = pbVar16 + 1) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_840,"Found LCOV File: ",0x11);
                        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_840,(pbVar16->_M_dataplus)._M_p,
                                            pbVar16->_M_string_length);
                        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                        std::ostream::put((char)poVar8);
                        std::ostream::flush();
                        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar2,5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5d5,(char *)local_368._0_8_,
                                     (this->super_cmCTestGenericHandler).Quiet);
                        if ((_func_int **)local_368._0_8_ != local_358) {
                          operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
                        std::ios_base::~ios_base(local_7d0);
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_840,"SourceFile: ",0xc);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_840,local_8d8,local_8d0);
                      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5d9,(char *)local_368._0_8_,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
                      std::ios_base::~ios_base(local_7d0);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_840,"lCovFile: ",10);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_840,local_a08,local_a00);
                      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5db,(char *)local_368._0_8_,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
                      std::ios_base::~ios_base(local_7d0);
                      if ((local_a00 != 0) && (local_980._M_string_length != 0)) {
                        this_00 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                  ::operator[](local_5a8,&local_980);
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_840,"   in lcovFile: ",0x10);
                        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_840,local_a08,local_a00);
                        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                        std::ostream::put((char)poVar8);
                        std::ostream::flush();
                        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar2,5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5e4,(char *)local_368._0_8_,
                                     (this->super_cmCTestGenericHandler).Quiet);
                        if ((_func_int **)local_368._0_8_ != local_358) {
                          operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
                        std::ios_base::~ios_base(local_7d0);
                        std::ifstream::ifstream((ostringstream *)local_840,local_a08,_S_in);
                        if ((abStack_820[local_840[0][-3]] & 5) == 0) {
                          local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
                          local_9e0._M_string_length = 0;
                          local_9e0.field_2._M_local_buf[0] = '\0';
                          cmsys::SystemTools::GetLineFromStream
                                    ((istream *)local_840,&local_9e0,(bool *)0x0,-1);
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_368,"File is ready, start reading.",0x1d);
                          std::ios::widen((char)*(_func_int **)(local_368._0_8_ + -0x18) +
                                          (char)local_368);
                          std::ostream::put((char)local_368);
                          std::ostream::flush();
                          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                          std::__cxx11::stringbuf::str();
                          cmCTest::Log(pcVar2,5,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                       ,0x5f2,(char *)local_9c0[0],
                                       (this->super_cmCTestGenericHandler).Quiet);
                          if (local_9c0[0] != local_9b0) {
                            operator_delete(local_9c0[0],local_9b0[0] + 1);
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
                          std::ios_base::~ios_base(local_2f8);
                          while (bVar4 = cmsys::SystemTools::GetLineFromStream
                                                   ((istream *)local_840,&local_9e0,(bool *)0x0,-1),
                                bVar4) {
                            if (0xb < local_9e0._M_string_length) {
                              std::__cxx11::string::substr((ulong)local_368,(ulong)&local_9e0);
                              iVar5 = atoi((char *)local_368._0_8_);
                              std::__cxx11::string::substr((ulong)local_9c0,(ulong)&local_9e0);
                              plVar10 = local_9c0[0];
                              iVar6 = atoi((char *)local_9c0[0]);
                              if (0 < iVar6) {
                                uVar15 = (ulong)(iVar6 - 1);
                                piVar14 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start;
                                __position._M_current =
                                     (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish;
                                if ((ulong)((long)__position._M_current - (long)piVar14 >> 2) <=
                                    uVar15) {
                                  do {
                                    local_95c = -1;
                                    if (__position._M_current ==
                                        (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                                (this_00,__position,&local_95c);
                                      piVar14 = (this_00->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start;
                                      __position._M_current =
                                           (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_finish;
                                    }
                                    else {
                                      *__position._M_current = -1;
                                      __position._M_current = __position._M_current + 1;
                                      (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish =
                                           __position._M_current;
                                    }
                                  } while ((ulong)((long)__position._M_current - (long)piVar14 >> 2)
                                           <= uVar15);
                                }
                                iVar6 = piVar14[uVar15];
                                if (iVar6 < 0) {
                                  if (iVar5 < 1) {
                                    lVar13 = std::__cxx11::string::find((char)local_368,0x23);
                                    piVar14 = (this_00->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_start;
                                    if (lVar13 == -1) {
                                      iVar6 = piVar14[uVar15];
                                      goto LAB_0017830c;
                                    }
                                  }
                                  piVar14[uVar15] = 0;
                                  iVar6 = 0;
                                }
LAB_0017830c:
                                piVar14[uVar15] = iVar6 + iVar5;
                                plVar10 = local_9c0[0];
                              }
                              if (plVar10 != local_9b0) {
                                operator_delete(plVar10,local_9b0[0] + 1);
                              }
                              if ((_func_int **)local_368._0_8_ != local_358) {
                                operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                              }
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
                            operator_delete(local_9e0._M_dataplus._M_p,
                                            CONCAT71(local_9e0.field_2._M_allocated_capacity._1_7_,
                                                     local_9e0.field_2._M_local_buf[0]) + 1);
                          }
                        }
                        else {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_368,"Cannot open file: ",0x12);
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_368,local_a08,local_a00);
                          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                          std::ostream::put((char)poVar8);
                          std::ostream::flush();
                          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                          std::__cxx11::stringbuf::str();
                          cmCTest::Log(pcVar2,7,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                       ,0x5e9,local_9e0._M_dataplus._M_p,false);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
                            operator_delete(local_9e0._M_dataplus._M_p,
                                            CONCAT71(local_9e0.field_2._M_allocated_capacity._1_7_,
                                                     local_9e0.field_2._M_local_buf[0]) + 1);
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
                          std::ios_base::~ios_base(local_2f8);
                        }
                        local_980._M_string_length = 0;
                        *local_980._M_dataplus._M_p = '\0';
                        std::ifstream::~ifstream((ostringstream *)local_840);
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_840);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_840,"Error while parsing lcov file \'",0x1f);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_840,local_a08,local_a00);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\':",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," No source file name found!",0x1b);
                      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar2,7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5c9,(char *)local_368._0_8_,false);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
                      std::ios_base::~ios_base(local_7d0);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
                      operator_delete(local_8a0._M_dataplus._M_p,
                                      CONCAT71(local_8a0.field_2._M_allocated_capacity._1_7_,
                                               local_8a0.field_2._M_local_buf[0]) + 1);
                    }
                    std::ifstream::~ifstream(local_570);
                    if (!local_a25) {
                      local_9e4 = 1;
                      break;
                    }
                    pbVar11 = local_598 + 1;
                  } while (pbVar11 != local_5a0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
                  operator_delete(local_8f8._M_dataplus._M_p,
                                  CONCAT71(local_8f8.field_2._M_allocated_capacity._1_7_,
                                           local_8f8.field_2._M_local_buf[0]) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_918);
                if (local_880 != &local_870) {
                  operator_delete(local_880,CONCAT71(uStack_86f,local_870) + 1);
                }
                cmsys::Glob::~Glob(&local_188);
                if (local_a08 != &local_9f8) {
                  operator_delete(local_a08,CONCAT71(uStack_9f7,local_9f8) + 1);
                }
                if (local_8d8 != &local_8c8) {
                  operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
                }
                iVar5 = local_9e4;
                if (local_a25 == false) goto LAB_00178933;
                pbVar11 = local_5b0 + 1;
              } while (pbVar11 != local_5b8);
            }
            iVar5 = local_a24 * -0x3d70a3d7;
            local_a24 = local_a24 + 1;
            uVar7 = iVar5 + 0xc7ae1479;
            iVar5 = 0;
            if ((uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x51eb851) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_570," processed: ",0xc);
              poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)local_570,local_a24);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," out of ",8);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x627,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
              if (local_840[0] != local_830) {
                operator_delete(local_840[0],local_830[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
              std::ios_base::~ios_base(local_500);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_570,"    ",4);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x628,(char *)local_840[0],(this->super_cmCTestGenericHandler).Quiet);
              if (local_840[0] != local_830) {
                operator_delete(local_840[0],local_830[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
              std::ios_base::~ios_base(local_500);
              iVar5 = 0;
            }
LAB_00178933:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_638);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_570,"Problem running coverage on file: ",0x22);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_570,(local_a10->_M_dataplus)._M_p,
                                local_a10->_M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x588,(char *)local_840[0],false);
            if (local_840[0] != local_830) {
              operator_delete(local_840[0],local_830[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
            std::ios_base::~ios_base(local_500);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_570,"Command produced error: ",0x18);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_570,local_958._M_dataplus._M_p,
                                local_958._M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x58a,(char *)local_840[0],false);
            if (local_840[0] != local_830) {
              operator_delete(local_840[0],local_830[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
            std::ios_base::~ios_base(local_500);
            cont->Error = cont->Error + 1;
            iVar5 = 0x11;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_dataplus._M_p != &local_958.field_2) {
            operator_delete(local_958._M_dataplus._M_p,
                            CONCAT71(local_958.field_2._M_allocated_capacity._1_7_,
                                     local_958.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
            operator_delete(local_9a0._M_dataplus._M_p,
                            CONCAT71(local_9a0.field_2._M_allocated_capacity._1_7_,
                                     local_9a0.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_570,"Unable to change working directory to ",0x26);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_570,local_938._M_dataplus._M_p,
                              local_938._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
          __s = strerror(local_1d0.ResultCode);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
          }
          else {
            sVar9 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
          }
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x570,(char *)local_840[0],false);
          if (local_840[0] != local_830) {
            operator_delete(local_840[0],local_830[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
          std::ios_base::~ios_base(local_500);
          cont->Error = cont->Error + 1;
          iVar5 = 0x11;
        }
        cmWorkingDirectory::~cmWorkingDirectory(&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_938._M_dataplus._M_p != &local_938.field_2) {
          operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
        }
        if ((iVar5 != 0x11) && (iVar5 != 0)) goto LAB_00178b38;
        local_a10 = local_a10 + 1;
      } while (local_a10 != local_5c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_618);
    cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_980._M_dataplus._M_p != &local_980.field_2) {
      operator_delete(local_980._M_dataplus._M_p,
                      CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                               local_980.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_570,"Error while finding LCov files.\n",0x20);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x545,(char *)local_840[0],false);
LAB_00178aeb:
    if (local_840[0] != local_830) {
      operator_delete(local_840[0],local_830[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
    std::ios_base::~ios_base(local_500);
    local_a24 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8b8);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if (local_860[0] != local_850) {
    operator_delete(local_860[0],local_850[0] + 1);
  }
LAB_00178c16:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  return local_a24;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  std::vector<std::string> covargs =
    cmSystemTools::ParseArguments(lcovExtraFlags);
  covargs.insert(covargs.begin(), lcovCommand);
  const std::string command = joinCommandLine(covargs);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (std::string const& f : files) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(f);
    cmWorkingDirectory workdir(fileDir);
    if (workdir.Failed()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to change working directory to "
                   << fileDir << " : "
                   << std::strerror(workdir.GetLastResult()) << std::endl);
      cont->Error++;
      continue;
    }

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(covargs, &output, &errors, &retVal,
                                      fileDir.c_str(),
                                      cmDuration::zero() /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Coverage command returned: "
                   << retVal << " while processing: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    cmsys::SystemTools::Split(output, lines);

    for (std::string const& line : lines) {
      std::string sourceFile;
      std::string lcovFile;

      if (line.empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      cmAppend(lcovFiles, gl.GetFiles());

      for (std::string const& file : lcovFiles) {
        lcovFile = file;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::string const& t : lcovFiles) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              cnt++;

              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile.clear();
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}